

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

bool __thiscall c4::yml::Tree::is_root(Tree *this,size_t node)

{
  code *pcVar1;
  Location loc;
  bool bVar2;
  undefined1 uVar3;
  error_flags eVar4;
  NodeData *pNVar5;
  csubstr cVar6;
  char *pcStack_20;
  
  pNVar5 = _p(this,node);
  if ((node != 0) && (pNVar5->m_parent == 0xffffffffffffffff)) {
    eVar4 = get_error_flags();
    if ((eVar4 & 1) != 0) {
      bVar2 = is_debugger_attached();
      if (bVar2) {
        pcVar1 = (code *)swi(3);
        uVar3 = (*pcVar1)();
        return (bool)uVar3;
      }
    }
    cVar6 = to_csubstr(
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                      );
    pcStack_20 = cVar6.str;
    loc.super_LineCol.col = 0;
    loc.super_LineCol.offset = SUB168(ZEXT816(0x4c04) << 0x40,0);
    loc.super_LineCol.line = SUB168(ZEXT816(0x4c04) << 0x40,8);
    loc.name.str = pcStack_20;
    loc.name.len = cVar6.len;
    yml::error("check failed: _p(node)->m_parent != NONE || node == 0",0x35,loc);
  }
  pNVar5 = _p(this,node);
  return pNVar5->m_parent == 0xffffffffffffffff;
}

Assistant:

bool has_parent(size_t node) const { return _p(node)->m_parent != NONE; }